

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_0::deviceFeatures2
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context)

{
  PlatformInterface *vkp;
  pointer ppVVar1;
  VkInstance pVVar2;
  TestStatus *pTVar3;
  int iVar4;
  TestError *this_00;
  ulong uVar5;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  VkPhysicalDeviceFeatures2KHR extFeatures;
  InstanceDriver vki;
  VkPhysicalDeviceFeatures coreFeatures;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_3c0;
  VkAllocationCallbacks *local_3a8;
  DestroyInstanceFunc local_3a0;
  VkInstance local_398;
  TestStatus *local_390;
  undefined1 local_388 [16];
  VkPhysicalDeviceFeatures *local_378 [28];
  InstanceDriver local_298;
  VkPhysicalDeviceFeatures local_10c;
  
  vkp = *(PlatformInterface **)(this + 8);
  createInstanceWithExtension((Move<vk::VkInstance_s_*> *)&local_298,vkp,(char *)context);
  local_3a0 = local_298.m_vk.destroyInstance;
  local_3a8 = (VkAllocationCallbacks *)local_298.m_vk.enumeratePhysicalDevices;
  local_398 = (VkInstance)local_298.super_InstanceInterface._vptr_InstanceInterface;
  ::vk::InstanceDriver::InstanceDriver
            (&local_298,vkp,(VkInstance)local_298.super_InstanceInterface._vptr_InstanceInterface);
  local_390 = __return_storage_ptr__;
  ::vk::enumeratePhysicalDevices
            (&local_3c0,&local_298.super_InstanceInterface,
             (VkInstance)local_298.super_InstanceInterface._vptr_InstanceInterface);
  if (local_3c0.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_3c0.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      ppVVar1 = local_3c0.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      memset(&local_10c,0xcd,0xdc);
      memset(local_378,0xcd,0xdc);
      local_388._0_4_ = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
      local_388._8_8_ = (void *)0x0;
      ::vk::InstanceDriver::getPhysicalDeviceFeatures(&local_298,ppVVar1[uVar5],&local_10c);
      ::vk::InstanceDriver::getPhysicalDeviceFeatures2KHR
                (&local_298,
                 local_3c0.
                 super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5],
                 (VkPhysicalDeviceFeatures2KHR *)local_388);
      if (local_388._0_4_ != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,
                   "extFeatures.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8b1);
LAB_0044acd4:
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((void *)local_388._8_8_ != (void *)0x0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"extFeatures.pNext == DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8b2);
        goto LAB_0044acd4;
      }
      iVar4 = bcmp(&local_10c,local_378,0xdc);
      if (iVar4 != 0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,
                   "Mismatch between features reported by vkGetPhysicalDeviceFeatures and vkGetPhysicalDeviceFeatures2KHR"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8b5);
        goto LAB_0044acd4;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_3c0.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_3c0.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_388._0_8_ = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,"Querying device features succeeded","");
  pTVar3 = local_390;
  local_390->m_code = QP_TEST_RESULT_PASS;
  (local_390->m_description)._M_dataplus._M_p = (pointer)&(local_390->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_390->m_description,local_388._0_8_,local_388._8_8_ + local_388._0_8_);
  if ((VkPhysicalDeviceFeatures **)local_388._0_8_ != local_378) {
    operator_delete((void *)local_388._0_8_,(ulong)((long)&local_378[0]->robustBufferAccess + 1));
  }
  pVVar2 = local_398;
  if (local_3c0.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c0.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c0.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c0.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_298);
  if (pVVar2 != (VkInstance)0x0) {
    (*local_3a0)(pVVar2,local_3a8);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus deviceFeatures2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		VkPhysicalDeviceFeatures		coreFeatures;
		VkPhysicalDeviceFeatures2KHR	extFeatures;

		deMemset(&coreFeatures, 0xcd, sizeof(coreFeatures));
		deMemset(&extFeatures.features, 0xcd, sizeof(extFeatures.features));

		extFeatures.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
		extFeatures.pNext = DE_NULL;

		vki.getPhysicalDeviceFeatures(devices[deviceNdx], &coreFeatures);
		vki.getPhysicalDeviceFeatures2KHR(devices[deviceNdx], &extFeatures);

		TCU_CHECK(extFeatures.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR);
		TCU_CHECK(extFeatures.pNext == DE_NULL);

		if (deMemCmp(&coreFeatures, &extFeatures.features, sizeof(VkPhysicalDeviceFeatures)) != 0)
			TCU_FAIL("Mismatch between features reported by vkGetPhysicalDeviceFeatures and vkGetPhysicalDeviceFeatures2KHR");
	}

	return tcu::TestStatus::pass("Querying device features succeeded");
}